

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

void __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erasenonleaf(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
               *this,int *cur,node **p,int *pp,locType *pos)

{
  node *pnVar1;
  locType *plVar2;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  node *pnVar7;
  undefined8 *puVar8;
  int iVar9;
  long lVar10;
  node *pnVar11;
  undefined8 *puVar12;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar13;
  undefined8 *puVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  unsigned_long_long *puVar24;
  unsigned_long_long *puVar25;
  long lStack_80;
  unsigned_long_long uStack_78;
  undefined8 uStack_70;
  locType *local_68;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_60 [2];
  ulong local_50;
  uint local_44;
  int *local_40;
  int *local_38;
  undefined4 extraout_var_00;
  
  iVar9 = *cur;
  lVar10 = (long)(pp[iVar9] + 1);
  lVar6 = lVar10 * 0x10 + 0x330;
  while( true ) {
    pnVar7 = p[iVar9];
    iVar16 = pnVar7->sz;
    if (iVar16 <= lVar10) break;
    *(undefined8 *)((long)pnVar7 + lVar6 + -0x18) = *(undefined8 *)((long)pnVar7 + lVar6 + -8);
    *(undefined4 *)((long)pnVar7 + lVar6 + -0x10) = *(undefined4 *)((long)&pnVar7->field_0 + lVar6);
    (pnVar7->field_0).val[lVar10] = *(long *)((long)&pnVar7->field_0 + lVar10 * 8 + 8);
    lVar10 = lVar10 + 1;
    lVar6 = lVar6 + 0x10;
  }
  pnVar7->sz = iVar16 + -1;
  lVar6 = (long)*cur;
  if (lVar6 == 0) {
    if (iVar16 + -1 == 0) {
      this->depth = this->depth + -1;
      lStack_80 = 0x10e1fd;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar13 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar13->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar16 < 0x32) {
      iVar16 = pp[lVar6 + -1];
      local_40 = cur;
      local_38 = pp;
      if (iVar16 == p[lVar6 + -1]->sz) {
        p[lVar6 + 1] = p[lVar6];
        pp[lVar6 + 1] = iVar16;
        lVar6 = (long)*cur;
        pos[lVar6 + 1] = pos[lVar6];
        pp[lVar6 + -1] = p[lVar6 + -1]->sz + -1;
        lVar6 = (long)*cur;
        pos[lVar6] = (p[lVar6 + -1]->field_0).val[pp[lVar6 + -1]];
        lStack_80 = 0x10dded;
        iVar5 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])();
        iVar16 = *cur;
        lVar6 = (long)iVar16;
        p[lVar6] = (node *)CONCAT44(extraout_var,iVar5);
        pnVar7 = p[lVar6 + 1];
      }
      else {
        pp[lVar6 + 1] = iVar16 + 1;
        lVar6 = (long)*cur;
        pos[lVar6 + 1] = (p[lVar6 + -1]->field_0).val[pp[lVar6 + 1]];
        lStack_80 = 0x10de2b;
        iVar16 = (*(this->file->
                   super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                   )._vptr_FileManager_Base[2])();
        pnVar7 = (node *)CONCAT44(extraout_var_00,iVar16);
        iVar16 = *cur;
        lVar6 = (long)iVar16;
        p[lVar6 + 1] = pnVar7;
      }
      piVar4 = local_40;
      pnVar11 = p[iVar9];
      iVar5 = pnVar11->sz;
      iVar15 = pnVar7->sz;
      local_44 = iVar15 + iVar5;
      if ((int)local_44 < 99) {
        pnVar1 = p[(long)iVar16 + -1];
        iVar16 = local_38[(long)iVar16 + -1];
        pnVar11->keyvalue[iVar5].first = pnVar1->keyvalue[iVar16].first;
        pnVar11->keyvalue[iVar5].second = pnVar1->keyvalue[iVar16].second;
        lVar10 = 0x66;
        for (lVar18 = 0; lVar18 < iVar15; lVar18 = lVar18 + 1) {
          (pnVar11->field_0).val[iVar5 + (int)lVar18 + 1] = (pnVar7->field_0).val[lVar18];
          pnVar11 = p[iVar9];
          iVar5 = pnVar11->sz;
          iVar16 = (int)lVar18 + 1 + iVar5;
          pnVar7 = p[lVar6 + 1];
          pnVar11->keyvalue[iVar16].first = *(unsigned_long_long *)((long)pnVar7 + lVar10 * 8 + -8);
          pnVar11->keyvalue[iVar16].second = *(int *)((long)&pnVar7->field_0 + lVar10 * 8);
          iVar15 = pnVar7->sz;
          lVar10 = lVar10 + 2;
        }
        lVar6 = (pnVar7->field_0).val[iVar15];
        iVar9 = iVar15 + iVar5 + 1;
        pnVar11->sz = iVar9;
        (pnVar11->field_0).val[iVar9] = lVar6;
        lStack_80 = 0x10dfc1;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])(this->file,pos + *local_40);
        lStack_80 = 0x10dfd2;
        DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        ::release(this->file,pos[(long)*piVar4 + 1]);
        uStack_70._4_4_ = *piVar4 + -1;
        lStack_80 = 0x10dfee;
        erasenonleaf(this,(int *)((long)&uStack_70 + 4),p,local_38,pos);
      }
      else {
        local_60[1] = (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
                       *)&uStack_78;
        uVar19 = (ulong)local_44;
        lVar10 = -(uVar19 * 8 + 0x1f & 0xfffffffffffffff0);
        puVar8 = (undefined8 *)((long)&uStack_78 + lVar10);
        local_50 = uVar19 + 1;
        puVar12 = puVar8 + (uVar19 + 1) * -2;
        puVar14 = puVar12;
        do {
          *puVar14 = 0;
          *(undefined4 *)(puVar14 + 1) = 0;
          piVar4 = local_40;
          puVar14 = puVar14 + 2;
        } while (puVar14 != puVar8);
        pnVar7 = p[iVar9];
        uVar20 = pnVar7->sz;
        lVar21 = (long)(int)uVar20;
        lVar18 = 0;
        uVar23 = 0;
        if (0 < (int)uVar20) {
          uVar23 = (ulong)uVar20;
        }
        for (; uVar23 * 8 != lVar18; lVar18 = lVar18 + 8) {
          *(undefined8 *)((long)puVar8 + lVar18) = *(undefined8 *)((long)&pnVar7->field_0 + lVar18);
          *(undefined8 *)((long)puVar12 + lVar18 * 2) =
               *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar18 * 2);
          *(undefined4 *)((long)puVar12 + lVar18 * 2 + 8) =
               *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar18 * 2);
        }
        local_60[0] = this;
        local_68 = pos;
        puVar8[lVar21] = (pnVar7->field_0).val[lVar21];
        pnVar11 = p[(long)*piVar4 + -1];
        iVar16 = local_38[(long)*piVar4 + -1];
        puVar24 = puVar12 + lVar21 * 2;
        puVar25 = puVar24 + 3;
        *puVar24 = pnVar11->keyvalue[iVar16].first;
        *(int *)(puVar24 + 1) = pnVar11->keyvalue[iVar16].second;
        for (lVar18 = 0; uVar23 = local_50, lVar21 + lVar18 < (long)uVar19; lVar18 = lVar18 + 1) {
          pnVar11 = p[lVar6 + 1];
          iVar16 = (int)lVar18;
          (puVar8 + lVar21)[lVar18 + 1] = (pnVar11->field_0).val[iVar16];
          puVar25[-1] = pnVar11->keyvalue[iVar16].first;
          *(int *)puVar25 = pnVar11->keyvalue[iVar16].second;
          puVar25 = puVar25 + 2;
        }
        pnVar11 = p[lVar6 + 1];
        lVar18 = (pnVar11->field_0).val[pnVar11->sz];
        puVar8[local_50] = lVar18;
        pBVar3 = local_60[0];
        plVar2 = local_68;
        uVar20 = (uint)(uVar23 >> 1) & 0x7fffffff;
        pnVar7->sz = uVar20;
        pnVar11->sz = local_44 - uVar20;
        lVar21 = 0;
        for (lVar17 = 0; lVar22 = (long)pnVar7->sz, lVar17 < lVar22; lVar17 = lVar17 + 1) {
          (pnVar7->field_0).val[lVar17] = puVar8[lVar17];
          pnVar7 = p[iVar9];
          *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar21) =
               *(undefined8 *)((long)puVar12 + lVar21);
          *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar21) =
               *(undefined4 *)((long)puVar12 + lVar21 + 8);
          lVar21 = lVar21 + 0x10;
        }
        (pnVar7->field_0).val[lVar22] = puVar8[lVar22];
        lVar17 = (long)p[iVar9]->sz;
        pnVar7 = p[(long)*local_40 + -1];
        iVar16 = local_38[(long)*local_40 + -1];
        pnVar7->keyvalue[iVar16].first = puVar12[lVar17 * 2];
        pnVar7->keyvalue[iVar16].second = *(int *)(puVar12 + lVar17 * 2 + 1);
        pnVar7 = p[lVar6 + 1];
        puVar12[-1] = 0x66;
        piVar4 = local_40;
        lVar21 = puVar12[-1];
        for (lVar22 = 0; lVar22 < pnVar7->sz; lVar22 = lVar22 + 1) {
          (pnVar7->field_0).val[lVar22] =
               *(long *)((long)&uStack_70 + (long)((int)lVar17 + (int)lVar22) * 8 + lVar10);
          lVar17 = (long)p[iVar9]->sz;
          pnVar7 = p[lVar6 + 1];
          *(undefined8 *)((long)pnVar7 + lVar21 * 8 + -8) = puVar12[(lVar17 + lVar22) * 2 + 2];
          *(undefined4 *)((long)&pnVar7->field_0 + lVar21 * 8) =
               *(undefined4 *)(puVar12 + (lVar17 + lVar22) * 2 + 3);
          lVar21 = lVar21 + 2;
        }
        (pnVar7->field_0).val[pnVar7->sz] = lVar18;
        pDVar13 = pBVar3->file;
        iVar9 = *local_40;
        UNRECOVERED_JUMPTABLE =
             (pDVar13->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x10e1bc;
        (*UNRECOVERED_JUMPTABLE)(pDVar13,plVar2 + iVar9);
        pDVar13 = pBVar3->file;
        iVar9 = *piVar4;
        UNRECOVERED_JUMPTABLE =
             (pDVar13->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x10e1d1;
        (*UNRECOVERED_JUMPTABLE)(pDVar13,plVar2 + (long)iVar9 + 1);
        pDVar13 = pBVar3->file;
        iVar9 = *piVar4;
        UNRECOVERED_JUMPTABLE =
             (pDVar13->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar12[-1] = 0x10e1e6;
        (*UNRECOVERED_JUMPTABLE)(pDVar13,plVar2 + (long)iVar9 + -1);
      }
      return;
    }
    pDVar13 = this->file;
    pos = pos + lVar6;
    UNRECOVERED_JUMPTABLE =
         (pDVar13->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar13,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }